

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.cpp
# Opt level: O3

void __thiscall CaDiCaL::Internal::probe_dominator_lrat(Internal *this,int dom,Clause *reason)

{
  int iVar1;
  uint uVar2;
  Flags FVar3;
  pointer pFVar4;
  iterator __position;
  pointer pVVar5;
  Clause *reason_00;
  iterator iVar6;
  uint uVar7;
  long lVar8;
  Clause *__range1;
  int other;
  uint64_t id;
  uint local_44;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_40;
  unsigned_long local_38;
  
  if ((dom != 0) && (this->lrat != false)) {
    iVar1 = reason->size;
    if ((long)iVar1 != 0) {
      local_40 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->lrat_chain;
      lVar8 = 0;
      do {
        uVar2 = *(uint *)((long)&reason[1].field_0 + lVar8);
        if ((this->vals[(int)uVar2] < '\0') && (local_44 = -uVar2, local_44 != dom)) {
          uVar7 = -uVar2;
          if (0 < (int)uVar2) {
            uVar7 = uVar2;
          }
          pFVar4 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          FVar3 = pFVar4[uVar7];
          if (((uint)FVar3 & 1) == 0) {
            pFVar4[uVar7] = (Flags)((uint)FVar3 | 1);
            __position._M_current =
                 (this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&this->analyzed,__position,
                         (int *)&local_44);
            }
            else {
              *__position._M_current = local_44;
              (this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar2 = -local_44;
            if (0 < (int)local_44) {
              uVar2 = local_44;
            }
            pVVar5 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (pVVar5[uVar2].level == 0) {
              local_38 = (this->unit_clauses_idx).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)(uVar2 << 1 | local_44 >> 0x1f)];
              iVar6._M_current =
                   (this->lrat_chain).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->lrat_chain).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>(local_40,iVar6,&local_38);
              }
              else {
                *iVar6._M_current = local_38;
                (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
            }
            else {
              reason_00 = pVVar5[uVar2].reason;
              if (reason_00 != (Clause *)0x0) {
                probe_dominator_lrat(this,dom,reason_00);
              }
            }
          }
        }
        lVar8 = lVar8 + 4;
      } while ((long)iVar1 * 4 != lVar8);
    }
    iVar6._M_current =
         (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->lrat_chain,iVar6,
                 (unsigned_long *)reason);
    }
    else {
      *iVar6._M_current = (unsigned_long)reason->field_0;
      (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
  }
  return;
}

Assistant:

void Internal::probe_dominator_lrat (int dom, Clause *reason) {
  if (!lrat || !dom)
    return;
  LOG (reason, "probe dominator LRAT for %d from", dom);
  for (const auto lit : *reason) {
    if (val (lit) >= 0)
      continue;
    const auto other = -lit;
    if (other == dom)
      continue;
    Flags &f = flags (other);
    if (f.seen)
      continue;
    f.seen = true;
    analyzed.push_back (other);
    Var u = var (other);
    if (u.level) {
      if (!u.reason) {
        LOG ("this may be a problem %d", other);
        continue;
      }
      probe_dominator_lrat (dom, u.reason);
      continue;
    }
    const unsigned uidx = vlit (other);
    uint64_t id = unit_clauses (uidx);
    assert (id);
    lrat_chain.push_back (id);
  }
  lrat_chain.push_back (reason->id);
}